

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveness.c
# Opt level: O1

char * retrieveLOName(Abc_Ntk_t *pNtkOld,Aig_Man_t *pAigOld,Aig_Man_t *pAigNew,Aig_Obj_t *pObjPivot,
                     Vec_Ptr_t *vLive,Vec_Ptr_t *vFair)

{
  Abc_Obj_t *pAVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  long lVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  
  uVar11 = pAigOld->nRegs;
  pcVar5 = (char *)malloc(0x32);
  if (((*(uint *)&pObjPivot->field_0x18 & 7) != 2) ||
     ((pObjPivot->field_0).CioId < pAigNew->nTruePis)) {
    __assert_fail("Saig_ObjIsLo( pAigNew, pObjPivot )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/live/liveness.c"
                  ,0x90,
                  "char *retrieveLOName(Abc_Ntk_t *, Aig_Man_t *, Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                 );
  }
  uVar10 = pAigNew->nRegs;
  if ((int)uVar10 < 1) {
    uVar10 = 0;
  }
  else {
    lVar8 = (long)pAigNew->nTruePis;
    lVar12 = 0;
    do {
      if ((pAigNew->nTruePis < 0) || (pAigNew->vCis->nSize <= lVar8)) goto LAB_0061ff8a;
      if ((Aig_Obj_t *)pAigNew->vCis->pArray[lVar8] == pObjPivot) {
        uVar10 = -(int)lVar12;
        break;
      }
      lVar12 = lVar12 + -1;
      lVar8 = lVar8 + 1;
    } while ((ulong)uVar10 + lVar12 != 0);
  }
  if ((int)uVar11 <= (int)uVar10) {
    if (uVar10 == uVar11) {
      pcVar7 = "SAVED_LO";
    }
    else {
      uVar2 = uVar11 * 2;
      pcVar7 = pcVar5;
      if ((int)uVar2 < (int)uVar10 || (int)uVar10 <= (int)uVar11) {
        if (((int)uVar2 < (int)uVar10) && ((int)uVar10 < (int)(vLive->nSize + (uVar2 | 1)))) {
          *pcVar5 = '\0';
          if (0 < pAigOld->nTruePos) {
            lVar8 = 0;
            iVar9 = 0;
            do {
              if ((pAigOld->vCos->nSize <= lVar8) || (pNtkOld->vPos->nSize <= lVar8))
              goto LAB_0061ff8a;
              pAVar1 = (Abc_Obj_t *)pNtkOld->vPos->pArray[lVar8];
              iVar3 = nodeName_starts_with(pAVar1,"assert_fair");
              if (iVar3 != 0) {
                if (iVar9 == uVar10 + ~uVar2) {
                  pcVar6 = Abc_ObjName(pAVar1);
                  sprintf(pcVar5,"%s__%s",pcVar6,"LIVENESS");
                  break;
                }
                iVar9 = iVar9 + 1;
              }
              lVar8 = lVar8 + 1;
            } while (lVar8 < pAigOld->nTruePos);
          }
          if (*pcVar5 == '\0') {
            __assert_fail("dummyStr[0] != \'\\0\'",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/live/liveness.c"
                          ,0xbb,
                          "char *retrieveLOName(Abc_Ntk_t *, Aig_Man_t *, Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                         );
          }
        }
        else {
          iVar9 = vLive->nSize;
          iVar3 = (uVar2 | 1) + iVar9;
          pcVar7 = "UNKNOWN";
          if ((iVar3 <= (int)uVar10) && ((int)uVar10 < iVar3 + vFair->nSize)) {
            *pcVar5 = '\0';
            if (0 < pAigOld->nTruePos) {
              lVar8 = 0;
              iVar3 = 0;
              do {
                if ((pAigOld->vCos->nSize <= lVar8) || (pNtkOld->vPos->nSize <= lVar8))
                goto LAB_0061ff8a;
                pAVar1 = (Abc_Obj_t *)pNtkOld->vPos->pArray[lVar8];
                iVar4 = nodeName_starts_with(pAVar1,"assume_fair");
                if (iVar4 != 0) {
                  if (iVar3 == (uVar10 + ~uVar2) - iVar9) {
                    pcVar7 = Abc_ObjName(pAVar1);
                    sprintf(pcVar5,"%s__%s",pcVar7,"FAIRNESS");
                    break;
                  }
                  iVar3 = iVar3 + 1;
                }
                lVar8 = lVar8 + 1;
              } while (lVar8 < pAigOld->nTruePos);
            }
            pcVar7 = pcVar5;
            if (*pcVar5 == '\0') {
              __assert_fail("dummyStr[0] != \'\\0\'",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/live/liveness.c"
                            ,0xd3,
                            "char *retrieveLOName(Abc_Ntk_t *, Aig_Man_t *, Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                           );
            }
          }
        }
      }
      else {
        uVar11 = uVar10 + ~uVar11 + pAigOld->nTruePis;
        if ((((int)uVar11 < 0) || (pAigOld->vCis->nSize <= (int)uVar11)) ||
           (pNtkOld->vCis->nSize <= (int)uVar11)) goto LAB_0061ff8a;
        pcVar6 = Abc_ObjName((Abc_Obj_t *)pNtkOld->vCis->pArray[uVar11]);
        sprintf(pcVar5,"%s__%s",pcVar6,"SHADOW");
      }
    }
    return pcVar7;
  }
  uVar10 = uVar10 + pAigOld->nTruePis;
  if (((-1 < (int)uVar10) && ((int)uVar10 < pAigOld->vCis->nSize)) &&
     ((int)uVar10 < pNtkOld->vCis->nSize)) {
    if (*(Aig_Obj_t **)((long)pAigOld->vCis->pArray[uVar10] + 0x28) != pObjPivot) {
      __assert_fail("pObjOld->pData == pObjPivot",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/live/liveness.c"
                    ,0x99,
                    "char *retrieveLOName(Abc_Ntk_t *, Aig_Man_t *, Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                   );
    }
    pcVar5 = Abc_ObjName((Abc_Obj_t *)pNtkOld->vCis->pArray[uVar10]);
    return pcVar5;
  }
LAB_0061ff8a:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

char * retrieveLOName( Abc_Ntk_t *pNtkOld, Aig_Man_t *pAigOld, Aig_Man_t *pAigNew, Aig_Obj_t *pObjPivot, Vec_Ptr_t *vLive, Vec_Ptr_t * vFair )
{
    Aig_Obj_t *pObjOld, *pObj;
    Abc_Obj_t *pNode;
    int index, oldIndex, originalLatchNum = Saig_ManRegNum(pAigOld), strMatch, i;
    char *dummyStr = (char *)malloc( sizeof(char) * 50 );

    assert( Saig_ObjIsLo( pAigNew, pObjPivot ) );
    Saig_ManForEachLo( pAigNew, pObj, index )
        if( pObj == pObjPivot )
            break;
    if( index < originalLatchNum )
    {
        oldIndex = Saig_ManPiNum( pAigOld ) + index;
        pObjOld = Aig_ManCi( pAigOld, oldIndex );
        pNode = Abc_NtkCi( pNtkOld, oldIndex );
        assert( pObjOld->pData == pObjPivot );
        return Abc_ObjName( pNode );
    }
    else if( index == originalLatchNum )
        return "SAVED_LO";
    else if( index > originalLatchNum && index < 2 * originalLatchNum + 1 )
    {
        oldIndex = Saig_ManPiNum( pAigOld ) + index - originalLatchNum - 1;
        pObjOld = Aig_ManCi( pAigOld, oldIndex );
        pNode = Abc_NtkCi( pNtkOld, oldIndex );
        sprintf( dummyStr, "%s__%s", Abc_ObjName( pNode ), "SHADOW");
        return dummyStr;
    }
    else if( index >= 2 * originalLatchNum + 1 && index < 2 * originalLatchNum + 1 + Vec_PtrSize( vLive ) )
    {
        oldIndex = index - 2 * originalLatchNum - 1;
        strMatch = 0;
        dummyStr[0] = '\0';
        Saig_ManForEachPo( pAigOld, pObj, i )
        {
            pNode = Abc_NtkPo( pNtkOld, i );
            //if( strstr( Abc_ObjName( pNode ), "assert_fair" ) != NULL )
            if(    nodeName_starts_with( pNode, "assert_fair" ) )
            {
                if( strMatch == oldIndex )
                {
                    sprintf( dummyStr, "%s__%s", Abc_ObjName( pNode ), "LIVENESS");
                    //return dummyStr;
                    break;
                }
                else
                    strMatch++;
            }
        }
        assert( dummyStr[0] != '\0' );
        return dummyStr;
    }
    else if( index >= 2 * originalLatchNum + 1 + Vec_PtrSize( vLive ) && index < 2 * originalLatchNum + 1 + Vec_PtrSize( vLive ) + Vec_PtrSize( vFair ) )
    {
        oldIndex = index - 2 * originalLatchNum - 1 - Vec_PtrSize( vLive );
        strMatch = 0;
        dummyStr[0] = '\0';
        Saig_ManForEachPo( pAigOld, pObj, i )
        {
            pNode = Abc_NtkPo( pNtkOld, i );
            //if( strstr( Abc_ObjName( pNode ), "assume_fair" ) != NULL )
            if(    nodeName_starts_with( pNode, "assume_fair" ) )
            {
                if( strMatch == oldIndex )
                {
                    sprintf( dummyStr, "%s__%s", Abc_ObjName( pNode ), "FAIRNESS");
                    //return dummyStr;
                    break;
                }
                else
                    strMatch++;
            }
        }
        assert( dummyStr[0] != '\0' );
        return dummyStr;
    }
    else
        return "UNKNOWN";
}